

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O3

void __thiscall ANN::fit(ANN *this,MatrixXd *X,MatrixXd *y)

{
  Layer *pLVar1;
  double *__ptr;
  MatrixXd *pMVar2;
  MatrixXd *pMVar3;
  Index IVar4;
  uint uVar5;
  long lVar6;
  MatrixXd predicted;
  DenseStorage<double,__1,__1,__1,_0> local_a8;
  MatrixXd *local_90;
  MatrixXd *local_88;
  Index IStack_80;
  MatrixXd local_78;
  DenseStorage<double,__1,__1,__1,_0> local_60;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)X);
  predict(&local_78,this,(MatrixXd *)&local_48);
  free(local_48.m_data);
  local_90 = y;
  local_88 = &local_78;
  if (((y->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows ==
       local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows)
     && ((y->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols ==
         local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
     ) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_90);
    Eigen::internal::
    inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false,_false>::run
              ((Matrix<double,__1,__1,_0,__1,__1> *)&local_a8);
    uVar5 = (int)((ulong)((long)(this->layers).super__Vector_base<Layer_*,_std::allocator<Layer_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->layers).super__Vector_base<Layer_*,_std::allocator<Layer_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
    if (0 < (int)uVar5) {
      lVar6 = (ulong)uVar5 + 1;
      do {
        pLVar1 = (this->layers).super__Vector_base<Layer_*,_std::allocator<Layer_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6 + -1];
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_60,&local_a8);
        (*pLVar1->_vptr_Layer[1])(&local_90,pLVar1,&local_60);
        IVar4 = IStack_80;
        pMVar3 = local_88;
        pMVar2 = local_90;
        __ptr = local_a8.m_data;
        local_90 = (MatrixXd *)local_a8.m_data;
        local_a8.m_data = (double *)pMVar2;
        local_88 = (MatrixXd *)local_a8.m_rows;
        IStack_80 = local_a8.m_cols;
        local_a8.m_rows = (Index)pMVar3;
        local_a8.m_cols = IVar4;
        free(__ptr);
        free(local_60.m_data);
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    free(local_a8.m_data);
    free(local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    return;
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x6e,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

void ANN::fit(Eigen::MatrixXd X, Eigen::MatrixXd y) {
    // Calculate feed forward for X
    Eigen::MatrixXd predicted = predict(X);
    // Calculate error for output
    Eigen::MatrixXd error = y - predicted;
    error.transposeInPlace();
    // Backpropagate error
    for(int i = layers.size()-1; i > 0; i--) {
        error = layers[i]->backward(error);
    }
}